

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleKernel.cpp
# Opt level: O2

void __thiscall
Ptex::v2_2::PtexTriangleKernelIter::applyConst
          (PtexTriangleKernelIter *this,float *dst,void *data,DataType dt,int nChan)

{
  float fVar1;
  int x;
  int iVar2;
  int iVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar1 = this->A;
  for (iVar4 = this->v1; iVar4 != this->v2; iVar4 = iVar4 + 1) {
    iVar3 = this->rowlen - iVar4;
    iVar2 = iVar3 - this->w2;
    if (iVar2 < this->u1) {
      iVar2 = this->u1;
    }
    iVar3 = iVar3 - this->w1;
    if (this->u2 < iVar3) {
      iVar3 = this->u2;
    }
    fVar5 = (float)iVar2 - this->u;
    fVar6 = (float)iVar4 - this->v;
    fVar7 = (fVar5 + fVar5 + 1.0) * this->A + fVar6 * this->B;
    fVar5 = this->A * fVar5 * fVar5 + (this->B * fVar5 + this->C * fVar6) * fVar6;
    for (; iVar2 < iVar3; iVar2 = iVar2 + 1) {
      if (fVar5 < 1.0) {
        fVar6 = anon_unknown_2::gaussian(fVar5);
        this->weight = fVar6 * this->wscale + this->weight;
      }
      fVar5 = fVar5 + fVar7;
      fVar7 = fVar7 + fVar1 + fVar1;
    }
  }
  PtexUtils::applyConst(this->weight,dst,data,dt,nChan);
  return;
}

Assistant:

void PtexTriangleKernelIter::applyConst(float* dst, void* data, DataType dt, int nChan)
{
    // iterate over texel locations and calculate weight as if texture weren't const
    float DDQ = 2.0f*A;
    for (int vi = v1; vi != v2; vi++) {
        int xw = rowlen - vi;
        int x1 = PtexUtils::max(u1, xw-w2);
        int x2 = PtexUtils::min(u2, xw-w1);
        float U = (float)x1 - u;
        float V = (float)vi - v;
        float DQ = A*(2.0f*U+1.0f)+B*V;
        float Q = A*U*U + (B*U + C*V)*V;
        for (int x = x1; x < x2; x++) {
            if (Q < 1.0f) {
                weight += gaussian(Q)*wscale;
            }
            Q += DQ;
            DQ += DDQ;
        }
    }

    // apply weight to single texel value
    PtexUtils::applyConst(weight, dst, data, dt, nChan);
}